

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O3

int32_t ra_advance_until_freeing(roaring_array_t *ra,uint16_t x,int32_t pos)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)pos;
  if (pos < ra->size) {
    uVar1 = (ulong)pos;
    do {
      if (x <= ra->keys[uVar1]) break;
      container_free(ra->containers[uVar1],ra->typecodes[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)ra->size);
  }
  return (int32_t)uVar1;
}

Assistant:

int32_t ra_advance_until_freeing(roaring_array_t *ra, uint16_t x, int32_t pos) {
    while (pos < ra->size && ra->keys[pos] < x) {
        container_free(ra->containers[pos], ra->typecodes[pos]);
        ++pos;
    }
    return pos;
}